

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeClose(sqlite3_vtab_cursor *cur)

{
  u32 *puVar1;
  Rtree *pRtree;
  
  pRtree = (Rtree *)cur->pVtab;
  resetCursor((RtreeCursor *)cur);
  sqlite3_finalize((sqlite3_stmt *)cur[7].pVtab);
  sqlite3_free(cur);
  puVar1 = &pRtree->nCursor;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) && (pRtree->inWrTrans == '\0')) {
    nodeBlobReset(pRtree);
  }
  return 0;
}

Assistant:

static int rtreeClose(sqlite3_vtab_cursor *cur){
  Rtree *pRtree = (Rtree *)(cur->pVtab);
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  assert( pRtree->nCursor>0 );
  resetCursor(pCsr);
  sqlite3_finalize(pCsr->pReadAux);
  sqlite3_free(pCsr);
  pRtree->nCursor--;
  if( pRtree->nCursor==0 && pRtree->inWrTrans==0 ){
    nodeBlobReset(pRtree);
  }
  return SQLITE_OK;
}